

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# archive_write_set_format_iso9660.c
# Opt level: O3

int isoent_add_child_tail(isoent *parent,isoent *child)

{
  int *piVar1;
  int iVar2;
  
  iVar2 = __archive_rb_tree_insert_node(&parent->rbtree,&child->rbnode);
  if (iVar2 == 0) {
    iVar2 = 0;
  }
  else {
    child->chnext = (isoent *)0x0;
    *(parent->children).last = child;
    (parent->children).last = &child->chnext;
    piVar1 = &(parent->children).cnt;
    *piVar1 = *piVar1 + 1;
    child->parent = parent;
    child->drnext = (isoent *)0x0;
    iVar2 = 1;
    if ((child->field_0xe8 & 2) != 0) {
      *(parent->subdirs).last = child;
      (parent->subdirs).last = &child->drnext;
      piVar1 = &(parent->subdirs).cnt;
      *piVar1 = *piVar1 + 1;
      child->parent = parent;
    }
  }
  return iVar2;
}

Assistant:

static int
isoent_add_child_tail(struct isoent *parent, struct isoent *child)
{

	if (!__archive_rb_tree_insert_node(
	    &(parent->rbtree), (struct archive_rb_node *)child))
		return (0);
	child->chnext = NULL;
	*parent->children.last = child;
	parent->children.last = &(child->chnext);
	parent->children.cnt++;
	child->parent = parent;

	/* Add a child to a sub-directory chain */
	child->drnext = NULL;
	if (child->dir) {
		*parent->subdirs.last = child;
		parent->subdirs.last = &(child->drnext);
		parent->subdirs.cnt++;
		child->parent = parent;
	}
	return (1);
}